

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

int __thiscall
TasGrid::GridLocalPolynomial::removePointsByHierarchicalCoefficient
          (GridLocalPolynomial *this,double tolerance,int output,double *scale_correction)

{
  int iVar1;
  int iVar2;
  pointer scale_correction_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  vector<bool,_std::allocator<bool>_> pmap;
  vector<double,_std::allocator<double>_> rescaled;
  allocator_type local_8b;
  allocator_type local_8a;
  bool local_89;
  vector<bool,_std::allocator<bool>_> local_88;
  double local_60;
  vector<double,_std::allocator<double>_> local_58;
  vector<double,_std::allocator<double>_> local_40;
  
  local_60 = tolerance;
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x18])();
  iVar2 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  scale_correction_00 = scale_correction;
  if (scale_correction == (double *)0x0) {
    iVar1 = 1;
    if (output == -1) {
      iVar1 = (this->super_BaseCanonicalGrid).num_outputs;
    }
    local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)&DAT_3ff0000000000000;
    ::std::vector<double,_std::allocator<double>_>::vector
              (&local_58,(long)(iVar1 * iVar2),(value_type_conflict2 *)&local_88,&local_8a);
    scale_correction_00 =
         local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  getScaledCoefficients(&local_40,this,output,scale_correction_00);
  if ((scale_correction == (double *)0x0) &&
     (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0)) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_89 = false;
  ::std::vector<bool,_std::allocator<bool>_>::vector(&local_88,(long)iVar2,&local_89,&local_8b);
  if (0 < iVar2) {
    uVar3 = 0;
    do {
      uVar4 = 1L << ((byte)uVar3 & 0x3f);
      uVar5 = uVar3 >> 6;
      if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3] <= local_60) {
        uVar4 = ~uVar4 & local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar5];
      }
      else {
        uVar4 = uVar4 | local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar5];
      }
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[uVar5] = uVar4;
      uVar3 = uVar3 + 1;
    } while ((long)iVar2 != uVar3);
  }
  iVar2 = removeMappedPoints(this,(vector<bool,_std::allocator<bool>_> *)&local_88);
  if (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar2;
}

Assistant:

int GridLocalPolynomial::removePointsByHierarchicalCoefficient(double tolerance, int output, const double *scale_correction){
    clearRefinement();
    int num_points = points.getNumIndexes();

    int active_outputs = (output == -1) ? num_outputs : 1;
    std::vector<double> rescaled = getScaledCoefficients(output, (scale_correction == nullptr) ?
                                        std::vector<double>(num_points * active_outputs, 1.0).data() : scale_correction);

    std::vector<bool> pmap(num_points); // point map, set to true if the point is to be kept, false otherwise
    for(int i=0; i<num_points; i++) pmap[i] = (rescaled[i] > tolerance);

    return removeMappedPoints(pmap);
}